

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

FloatParts parts_silence_nan(FloatParts a,float_status *status)

{
  flag fVar1;
  ulong uVar2;
  float_status *status_local;
  FloatParts a_local;
  uint64_t local_10;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    uVar2 = a.frac | 0x2000000000000000;
    a_local.frac._5_3_ = a._13_3_;
    a_local.frac._0_4_ = a.exp;
    local_10._0_4_ = (int32_t)a_local.frac;
    local_10._4_1_ = 4;
    local_10._5_1_ = (_Bool)a_local.frac._5_1_;
    local_10._6_2_ = a_local.frac._6_2_;
    a_local.exp = (int)uVar2;
    a_local.cls = (char)(uVar2 >> 0x20);
    a_local.sign = (_Bool)(char)(uVar2 >> 0x28);
    a_local._14_2_ = (short)(uVar2 >> 0x30);
  }
  else {
    join_0x00000010_0x00000000_ = parts_default_nan(status);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts parts_silence_nan(FloatParts a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    g_assert_not_reached();
#elif defined(TARGET_HPPA)
    a.frac &= ~(1ULL << (DECOMPOSED_BINARY_POINT - 1));
    a.frac |= 1ULL << (DECOMPOSED_BINARY_POINT - 2);
#else
    if (snan_bit_is_one(status)) {
        return parts_default_nan(status);
    } else {
        a.frac |= 1ULL << (DECOMPOSED_BINARY_POINT - 1);
    }
#endif
    a.cls = float_class_qnan;
    return a;
}